

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoDiamondAAreHigh.h
# Opt level: O3

int __thiscall
TwoDiamondAAreHigh::getHighestCardID
          (TwoDiamondAAreHigh *this,int previous,vector<Card,_std::allocator<Card>_> *cards)

{
  int iVar1;
  __normal_iterator<const_Card_*,_std::vector<Card,_std::allocator<Card>_>_> _Var2;
  
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<Card_const*,std::vector<Card,std::allocator<Card>>>,__gnu_cxx::__ops::_Iter_equals_val<Card_const>>
                    ((cards->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (cards->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  iVar1 = (int)((ulong)((long)_Var2._M_current -
                       (long)(cards->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
  if (_Var2._M_current ==
      (cards->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    iVar1 = previous;
  }
  return iVar1;
}

Assistant:

virtual int getHighestCardID(int previous, const std::vector<Card> &cards){
        auto it = std::find(cards.begin(), cards.end(), Card(Suit::DIAMONDS, CardValue::ASS));
        if(it != cards.end()){
           return (int) std::distance(cards.begin(), it);
        } else {
            return previous;
        }
    }